

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void basisu::vector<basist::ktx2_etc1s_image_desc>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  uint in_EDX;
  long in_RSI;
  ktx2_etc1s_image_desc *in_RDI;
  ktx2_etc1s_image_desc *pDst;
  ktx2_etc1s_image_desc *pSrc_end;
  ktx2_etc1s_image_desc *pSrc;
  ktx2_etc1s_image_desc *in_stack_ffffffffffffffc8;
  long local_20;
  
  for (local_20 = in_RSI; local_20 != in_RSI + (ulong)in_EDX * 0x14; local_20 = local_20 + 0x14) {
    basist::ktx2_etc1s_image_desc::ktx2_etc1s_image_desc(in_RDI,in_stack_ffffffffffffffc8);
    in_RDI = in_RDI + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }